

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraint.c
# Opt level: O0

void test_want(Constraint *constraint,char *function,CgreenValue actual,char *test_file,
              int test_line,TestReporter *reporter)

{
  code *pcVar1;
  _Bool _Var2;
  byte bVar3;
  char *__ptr;
  void *__ptr_00;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  char parameter_name_actual_string [255];
  char *message;
  intptr_t in_stack_fffffffffffffe98;
  Constraint *in_stack_fffffffffffffea0;
  char local_138 [72];
  intptr_t in_stack_ffffffffffffff10;
  Constraint *in_stack_ffffffffffffff18;
  
  _Var2 = parameters_are_not_valid_for(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  if (_Var2) {
    __ptr = validation_failure_message_for(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    (**(code **)(in_R8 + 0x38))(in_R8,in_RDX,in_ECX,0,__ptr);
    free(__ptr);
  }
  else {
    snprintf(local_138,0xfe,"[%s] parameter in [%s]",*(undefined8 *)(in_RDI + 0x60),in_RSI);
    __ptr_00 = (void *)(**(code **)(in_RDI + 0x28))(in_RDI,local_138,in_stack_00000010);
    pcVar1 = *(code **)(in_R8 + 0x38);
    bVar3 = (**(code **)(in_RDI + 0x18))(in_RDI);
    (*pcVar1)(in_R8,in_RDX,in_ECX,bVar3 & 1,__ptr_00,pcVar1,in_stack_00000008,in_stack_00000010,
              in_stack_00000018);
    free(__ptr_00);
  }
  return;
}

Assistant:

void test_want(Constraint *constraint, const char *function, CgreenValue actual,
               const char *test_file, int test_line, TestReporter *reporter) {
    char *message;
    char parameter_name_actual_string[255];

    if (parameters_are_not_valid_for(constraint, actual.value.integer_value)) {
        message = validation_failure_message_for(constraint, actual.value.integer_value);

        (*reporter->assert_true)(
                reporter,
                test_file,
                test_line,
                false,
                message);

        free(message);

        return;
    }

    snprintf(parameter_name_actual_string, sizeof(parameter_name_actual_string) - 1, "[%s] parameter in [%s]", constraint->parameter_name, function);
    message = constraint->failure_message(constraint, parameter_name_actual_string, actual.value.integer_value);

    (*reporter->assert_true)(
            reporter,
            test_file,
            test_line,
            (*constraint->compare)(constraint, actual),
            message);

    free(message);
}